

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::DoAtomicRmw<unsigned_long,unsigned_int>
          (Thread *this,BinopFunc<unsigned_int,_unsigned_int> *f,Instr instr,Ptr *out_trap)

{
  Store *pSVar1;
  bool bVar2;
  RefVec *this_00;
  const_reference pvVar3;
  Memory *this_01;
  string local_90;
  Ptr local_70;
  Enum local_58;
  uint local_54;
  u32 local_50;
  uint old;
  u32 offset;
  uint val;
  undefined1 local_40 [8];
  Ptr memory;
  Ptr *out_trap_local;
  BinopFunc<unsigned_int,_unsigned_int> *f_local;
  Thread *this_local;
  
  pSVar1 = this->store_;
  memory.root_index_ = (Index)out_trap;
  out_trap_local = (Ptr *)f;
  f_local = (BinopFunc<unsigned_int,_unsigned_int> *)this;
  this_00 = Instance::memories(this->inst_);
  pvVar3 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                     (this_00,(ulong)instr.field_2.imm_u32);
  _offset = pvVar3->index;
  RefPtr<wabt::interp::Memory>::RefPtr((RefPtr<wabt::interp::Memory> *)local_40,pSVar1,_offset);
  old = Pop<unsigned_int>(this);
  local_50 = Pop<unsigned_int>(this);
  this_01 = RefPtr<wabt::interp::Memory>::operator->((RefPtr<wabt::interp::Memory> *)local_40);
  local_58 = (Enum)Memory::AtomicRmw<unsigned_int,unsigned_int(*&)(unsigned_int,unsigned_int)>
                             (this_01,local_50,instr.field_2.imm_u32x2.snd,old,
                              (BinopFunc<unsigned_int,_unsigned_int> **)&out_trap_local,&local_54);
  bVar2 = Failed((Result)local_58);
  if (bVar2) {
    pSVar1 = this->store_;
    StringPrintf_abi_cxx11_
              (&local_90,"invalid atomic access at %u+%u",(ulong)local_50,
               (ulong)instr.field_2.imm_u32x2.snd);
    Trap::New(&local_70,pSVar1,&local_90,&this->frames_);
    RefPtr<wabt::interp::Trap>::operator=
              ((RefPtr<wabt::interp::Trap> *)memory.root_index_,&local_70);
    this_local._4_4_ = Trap;
    RefPtr<wabt::interp::Trap>::~RefPtr(&local_70);
    std::__cxx11::string::~string((string *)&local_90);
  }
  else {
    Push<unsigned_long>(this,(ulong)local_54);
    this_local._4_4_ = Ok;
  }
  RefPtr<wabt::interp::Memory>::~RefPtr((RefPtr<wabt::interp::Memory> *)local_40);
  return this_local._4_4_;
}

Assistant:

RunResult Thread::DoAtomicRmw(BinopFunc<T, T> f,
                              Instr instr,
                              Trap::Ptr* out_trap) {
  Memory::Ptr memory{store_, inst_->memories()[instr.imm_u32x2.fst]};
  T val = Pop<T>();
  u32 offset = Pop<u32>();
  T old;
  TRAP_IF(Failed(memory->AtomicRmw(offset, instr.imm_u32x2.snd, val, f, &old)),
          StringPrintf("invalid atomic access at %u+%u", offset,
                       instr.imm_u32x2.snd));
  Push(static_cast<R>(old));
  return RunResult::Ok;
}